

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nonstd::sv_lite::to_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,sv_lite *this,basic_string_view<char,_std::char_traits<char>_> v,allocator<char> *a)

{
  const_iterator __beg;
  const_iterator __end;
  string local_48 [32];
  allocator<char> *local_28;
  allocator<char> *a_local;
  basic_string_view<char,_std::char_traits<char>_> v_local;
  
  local_28 = (allocator<char> *)v.size_;
  v_local.data_ = v.data_;
  a_local = (allocator<char> *)this;
  v_local.size_ = (size_type)__return_storage_ptr__;
  __beg = basic_string_view<char,_std::char_traits<char>_>::begin
                    ((basic_string_view<char,_std::char_traits<char>_> *)&a_local);
  __end = basic_string_view<char,_std::char_traits<char>_>::end
                    ((basic_string_view<char,_std::char_traits<char>_> *)&a_local);
  std::__cxx11::string::string<char_const*,void>(local_48,__beg,__end,local_28);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_48);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT, Traits, Allocator>
to_string( basic_string_view<CharT, Traits> v, Allocator const & a = Allocator() )
{
    return std::basic_string<CharT,Traits, Allocator>( v.begin(), v.end(), a );
}